

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O3

void __thiscall
FZFile::parse(FZFile *this,vector<char,_std::allocator<char>_> *buf,array<unsigned_int,_44UL> *fzkey
             )

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  char cVar3;
  BRDPartMountingSide BVar4;
  iterator __position;
  iterator __position_00;
  pointer pbVar5;
  char *pcVar6;
  pointer pBVar7;
  double dVar8;
  byte *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  bool bVar11;
  int iVar12;
  undefined4 uVar13;
  char *pcVar14;
  long *plVar15;
  char *buffer;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  mapped_type *pmVar17;
  pointer extraout_RAX;
  uint *puVar18;
  size_t sVar19;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  undefined8 *puVar20;
  BRDPoint *pBVar21;
  long lVar22;
  iterator iVar23;
  undefined8 uVar24;
  ulong *puVar25;
  _func_int **pp_Var26;
  char **ppcVar27;
  size_type *psVar28;
  BRDPoint BVar29;
  byte *pbVar30;
  long *plVar31;
  size_t __n;
  array<unsigned_int,_44UL> *extraout_RDX;
  array<unsigned_int,_44UL> *extraout_RDX_00;
  array<unsigned_int,_44UL> *paVar32;
  array<unsigned_int,_44UL> *fzkey_00;
  string *psVar33;
  pointer pFVar34;
  byte bVar35;
  pointer ppcVar36;
  ulong uVar37;
  long lVar38;
  pointer pcVar39;
  pointer pBVar40;
  pointer pBVar41;
  byte *pbVar42;
  pointer pbVar43;
  pointer ppcVar44;
  ulong uVar45;
  FZFile *this_00;
  uint uVar46;
  pointer pcVar47;
  double dVar48;
  char *p;
  string __str;
  char *s;
  BRDPart part;
  char *p_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  char *arena_end;
  char *arena;
  size_t descr_size;
  size_t content_size;
  vector<char_*,_std::allocator<char_*>_> lines_descr;
  vector<char_*,_std::allocator<char_*>_> lines_content;
  undefined1 local_298 [32];
  undefined1 local_278 [16];
  undefined1 local_268 [40];
  char *local_240;
  long lStack_238;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [16];
  _func_int *local_1e0;
  undefined1 auStack_1d8 [16];
  pointer local_1c8;
  BRDPoint local_1c0;
  pointer ppStack_1b8;
  FZFile *local_1b0;
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [36];
  BRDPoint BStack_16c;
  byte *local_160;
  undefined1 local_158 [32];
  float local_138;
  pointer local_130;
  pointer pFStack_128;
  pointer local_120;
  pointer local_118;
  char *local_110;
  char *local_108;
  pointer local_100;
  char *local_f8;
  char *local_f0;
  char **local_e8;
  long local_e0;
  char *local_d8 [2];
  vector<char_*,_std::allocator<char_*>_> local_c8;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_b0;
  long *local_a8 [2];
  long local_98 [2];
  vector<char_*,_std::allocator<char_*>_> local_88;
  vector<BRDPin,std::allocator<BRDPin>> *local_70;
  vector<BRDNail,std::allocator<BRDNail>> *local_68;
  FZFile *local_60;
  char *local_58;
  string local_50;
  pointer pBVar16;
  
  pcVar39 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish +
            -(long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  local_58 = setlocale(1,"C");
  bVar11 = check_fz_key<44ul>(this,fzkey);
  paVar32 = &this->key;
  if (bVar11) {
    memcpy(paVar32,fzkey,0xb0);
  }
  else {
    bVar11 = check_fz_key<44ul>(this,paVar32);
    if (!bVar11) {
      (this->super_BRDFileBase).valid = false;
      (*(this->super_BRDFileBase)._vptr_BRDFileBase[3])(local_1a8,this);
      psVar33 = &(this->super_BRDFileBase).error_msg;
      std::__cxx11::string::_M_assign((string *)psVar33);
      paVar32 = extraout_RDX;
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        paVar32 = extraout_RDX_00;
      }
      fz_key_to_string<44ul>((string *)local_1a8,(FZFile *)fzkey,paVar32);
      std::__cxx11::string::_M_append((char *)psVar33,local_1a8._0_8_);
      if (local_1a8._0_8_ == (long)local_1a8 + 0x10) {
        return;
      }
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      return;
    }
  }
  local_1b0 = this;
  if (pcVar39 < (pointer)0x5) {
    auStack_1d8._8_8_ = &local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(auStack_1d8 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
               ,"");
    puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
    puVar25 = puVar20 + 2;
    if ((ulong *)*puVar20 == puVar25) {
      local_240 = (char *)*puVar25;
      lStack_238 = puVar20[3];
      local_268._24_8_ = local_268 + 0x28;
    }
    else {
      local_240 = (char *)*puVar25;
      local_268._24_8_ = (ulong *)*puVar20;
    }
    local_268._32_8_ = puVar20[1];
    *puVar20 = puVar25;
    puVar20[1] = 0;
    *(undefined1 *)(puVar20 + 2) = 0;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct((ulong)(local_268 + 0x38),'\x03');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,3,0xe5);
    pcVar14 = (char *)0xf;
    if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
      pcVar14 = local_240;
    }
    if (pcVar14 < (char *)(local_230._M_string_length + local_268._32_8_)) {
      uVar24 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        uVar24 = local_230.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < (char *)(local_230._M_string_length + local_268._32_8_))
      goto LAB_001458c1;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)(local_268 + 0x38),0,(char *)0x0,local_268._24_8_);
    }
    else {
LAB_001458c1:
      puVar20 = (undefined8 *)
                std::__cxx11::string::_M_append(local_268 + 0x18,(ulong)local_230._M_dataplus._M_p);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    psVar28 = puVar20 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar20 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar28) {
      local_210.field_2._M_allocated_capacity = *psVar28;
      local_210.field_2._8_8_ = puVar20[3];
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar28;
      local_210._M_dataplus._M_p = (pointer)*puVar20;
    }
    local_210._M_string_length = puVar20[1];
    *puVar20 = psVar28;
    puVar20[1] = 0;
    *(undefined1 *)psVar28 = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_1f0._0_8_ = &local_1e0;
    pp_Var26 = (_func_int **)(plVar15 + 2);
    if ((_func_int **)*plVar15 == pp_Var26) {
      local_1e0 = *pp_Var26;
      auStack_1d8._0_8_ = plVar15[3];
    }
    else {
      local_1e0 = *pp_Var26;
      local_1f0._0_8_ = (_func_int **)*plVar15;
    }
    local_1f0._8_8_ = plVar15[1];
    *plVar15 = (long)pp_Var26;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_1f0);
    local_278._0_8_ = local_268;
    pbVar43 = (pointer)(plVar15 + 2);
    if ((pointer)*plVar15 == pbVar43) {
      local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
      local_268._8_8_ = plVar15[3];
    }
    else {
      local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
      local_278._0_8_ = (pointer)*plVar15;
    }
    local_278._8_8_ = plVar15[1];
    *plVar15 = (long)pbVar43;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_278);
    local_298._0_8_ = local_298 + 0x10;
    ppcVar27 = (char **)(plVar15 + 2);
    if ((char **)*plVar15 == ppcVar27) {
      local_298._16_8_ = *ppcVar27;
      local_298._24_8_ = plVar15[3];
    }
    else {
      local_298._16_8_ = *ppcVar27;
      local_298._0_8_ = (char **)*plVar15;
    }
    local_298._8_8_ = plVar15[1];
    *plVar15 = (long)ppcVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_298);
    local_158._0_8_ = local_158 + 0x10;
    psVar28 = (size_type *)(plVar15 + 2);
    if ((size_type *)*plVar15 == psVar28) {
      local_158._16_8_ = *psVar28;
      local_158._24_8_ = plVar15[3];
    }
    else {
      local_158._16_8_ = *psVar28;
      local_158._0_8_ = (size_type *)*plVar15;
    }
    local_158._8_8_ = plVar15[1];
    *plVar15 = (long)psVar28;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
LAB_00145aae:
    BVar29 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar29) {
      local_1a8._16_8_ = *(undefined8 *)BVar29;
      auStack_190._0_8_ = pBVar21[3];
      local_1a8._0_8_ = (long)local_1a8 + 0x10;
    }
    else {
      local_1a8._16_8_ = *(undefined8 *)BVar29;
      local_1a8._0_8_ = *pBVar21;
    }
    local_1a8._8_8_ = pBVar21[1];
    *pBVar21 = BVar29;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    psVar33 = &(local_1b0->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar33,(string *)local_1a8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
LAB_00145b6a:
      operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
    }
LAB_00145b77:
    bVar11 = (pointer)local_278._0_8_ == (pointer)local_268;
LAB_00145b84:
    if (!bVar11) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
    }
    if ((_func_int **)local_1f0._0_8_ != &local_1e0) {
      operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      (ulong)(local_230.field_2._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
LAB_00145bff:
      operator_delete((void *)local_268._24_8_,(ulong)(local_240 + 1));
    }
LAB_00145c0c:
    if ((BRDPoint *)auStack_1d8._8_8_ == &local_1c0) goto LAB_00145c29;
  }
  else {
    sVar19 = (long)(pcVar39 + 1) * 3;
    local_60 = (FZFile *)paVar32;
    pcVar14 = (char *)calloc(1,sVar19);
    (this->super_BRDFileBase).file_buf = pcVar14;
    if (pcVar14 == (char *)0x0) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
      puVar25 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = puVar20[3];
        local_268._24_8_ = local_268 + 0x28;
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*puVar20;
      }
      local_268._32_8_ = puVar20[1];
      *puVar20 = puVar25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct((ulong)(local_268 + 0x38),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,3,0xe8);
      pcVar14 = (char *)0xf;
      if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
        pcVar14 = local_240;
      }
      if (pcVar14 < (char *)(local_230._M_string_length + local_268._32_8_)) {
        uVar24 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar24 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < (char *)(local_230._M_string_length + local_268._32_8_))
        goto LAB_001467a1;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_268 + 0x38),0,(char *)0x0,local_268._24_8_);
      }
      else {
LAB_001467a1:
        puVar20 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            (local_268 + 0x18,(ulong)local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar28 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar28) {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210.field_2._8_8_ = puVar20[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_210._M_string_length = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)psVar28 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      local_278._0_8_ = local_268;
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      local_158._0_8_ = local_158 + 0x10;
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
LAB_00146b77:
      BVar29 = (BRDPoint)(pBVar21 + 2);
      if (*pBVar21 == BVar29) {
        local_1a8._16_8_ = *(undefined8 *)BVar29;
        auStack_190._0_8_ = pBVar21[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar29;
        local_1a8._0_8_ = *pBVar21;
      }
      local_1a8._8_8_ = pBVar21[1];
      *pBVar21 = BVar29;
      pBVar21[1].x = 0;
      pBVar21[1].y = 0;
      *(undefined1 *)&pBVar21[2].x = 0;
      psVar33 = &(local_1b0->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar33,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
      }
      if ((_func_int **)local_1f0._0_8_ != &local_1e0) {
        operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        (ulong)(local_230.field_2._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) goto LAB_00145bff;
      goto LAB_00145c0c;
    }
    pcVar47 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
    __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar47;
    if (__n != 0) {
      memmove(pcVar14,pcVar47,__n);
    }
    pcVar14[(long)pcVar39] = '\0';
    local_108 = pcVar14 + (long)(pcVar39 + 1);
    local_110 = pcVar14 + (sVar19 - 1);
    pcVar14[sVar19 - 1] = '\0';
    if ((pcVar14[4] != 'x') || ((pcVar14[5] != -100 && (pcVar14[5] != -0x26)))) {
      decode(this,pcVar14,(size_t)pcVar39);
    }
    local_f0 = (pointer)0x0;
    local_f8 = (pointer)0x0;
    if (((int)((uint)(byte)pcVar14[(long)(pcVar39 + -1)] << 0x18) < 0) ||
       (pcVar47 = (pointer)(ulong)CONCAT13(pcVar14[(long)(pcVar39 + -1)],
                                           CONCAT12(pcVar14[(long)(pcVar39 + -2)],
                                                    *(undefined2 *)(pcVar14 + (long)(pcVar39 + -4)))
                                          ), pcVar39 < pcVar47)) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      plVar15 = (long *)std::__cxx11::string::append(auStack_1d8 + 8);
      puVar25 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = plVar15[3];
        local_268._24_8_ = local_268 + 0x28;
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*plVar15;
      }
      local_268._32_8_ = plVar15[1];
      *plVar15 = (long)puVar25;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct((ulong)(local_268 + 0x38),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,3,0x115);
      pcVar14 = (char *)0xf;
      if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
        pcVar14 = local_240;
      }
      if (pcVar14 < (char *)(local_230._M_string_length + local_268._32_8_)) {
        uVar24 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar24 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < (char *)(local_230._M_string_length + local_268._32_8_))
        goto LAB_001466fd;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_268 + 0x38),0,(char *)0x0,local_268._24_8_);
      }
      else {
LAB_001466fd:
        puVar20 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            (local_268 + 0x18,(ulong)local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar28 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar28) {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210.field_2._8_8_ = puVar20[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_210._M_string_length = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)psVar28 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      local_278._0_8_ = local_268;
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      local_158._0_8_ = local_158 + 0x10;
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
      goto LAB_00146b77;
    }
    local_f0 = pcVar39 + (4 - (long)pcVar47);
    local_f8 = pcVar47;
    if (local_f0 == (pointer)0x0) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
      puVar25 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = puVar20[3];
        local_268._24_8_ = local_268 + 0x28;
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*puVar20;
      }
      local_268._32_8_ = puVar20[1];
      *puVar20 = puVar25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct((ulong)(local_268 + 0x38),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,3,0x116);
      pcVar14 = (char *)0xf;
      if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
        pcVar14 = local_240;
      }
      if (pcVar14 < (char *)(local_230._M_string_length + local_268._32_8_)) {
        uVar24 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar24 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < (char *)(local_230._M_string_length + local_268._32_8_))
        goto LAB_00146e9a;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_268 + 0x38),0,(char *)0x0,local_268._24_8_);
      }
      else {
LAB_00146e9a:
        puVar20 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            (local_268 + 0x18,(ulong)local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar28 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar28) {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210.field_2._8_8_ = puVar20[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_210._M_string_length = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)psVar28 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      local_278._0_8_ = local_268;
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      local_158._0_8_ = local_158 + 0x10;
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
      goto LAB_00145aae;
    }
    buffer = decompress(pcVar14 + 4,(size_t)local_f0,(size_t *)&local_f0);
    pcVar6 = local_f0;
    if (buffer == (char *)0x0) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
      puVar25 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = puVar20[3];
        local_268._24_8_ = local_268 + 0x28;
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*puVar20;
      }
      local_268._32_8_ = puVar20[1];
      *puVar20 = puVar25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct((ulong)(local_268 + 0x38),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,3,0x118);
      pcVar14 = (char *)0xf;
      if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
        pcVar14 = local_240;
      }
      if (pcVar14 < (char *)(local_230._M_string_length + local_268._32_8_)) {
        uVar24 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar24 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < (char *)(local_230._M_string_length + local_268._32_8_))
        goto LAB_00147185;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_268 + 0x38),0,(char *)0x0,local_268._24_8_);
      }
      else {
LAB_00147185:
        puVar20 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            (local_268 + 0x18,(ulong)local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar28 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar28) {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210.field_2._8_8_ = puVar20[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_210._M_string_length = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)psVar28 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
        local_278._0_8_ = (pointer)local_268;
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
        local_158._0_8_ = local_158 + 0x10;
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
      BVar29 = (BRDPoint)(pBVar21 + 2);
      if (*pBVar21 == BVar29) {
        local_1a8._16_8_ = *(undefined8 *)BVar29;
        auStack_190._0_8_ = pBVar21[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar29;
        local_1a8._0_8_ = *pBVar21;
      }
      local_1a8._8_8_ = pBVar21[1];
      *pBVar21 = BVar29;
      pBVar21[1].x = 0;
      pBVar21[1].y = 0;
      *(undefined1 *)&pBVar21[2].x = 0;
      psVar33 = &(local_1b0->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar33,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      bVar11 = (pointer)local_278._0_8_ == (pointer)local_268;
      goto LAB_00145b84;
    }
    if (local_f0 == (pointer)0x0) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
      puVar25 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = puVar20[3];
        local_268._24_8_ = local_268 + 0x28;
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*puVar20;
      }
      local_268._32_8_ = puVar20[1];
      *puVar20 = puVar25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct((ulong)(local_268 + 0x38),'\x03');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,3,0x119);
      pcVar14 = (char *)0xf;
      if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
        pcVar14 = local_240;
      }
      if (pcVar14 < (char *)(local_230._M_string_length + local_268._32_8_)) {
        uVar24 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar24 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < (char *)(local_230._M_string_length + local_268._32_8_))
        goto LAB_00147545;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)(local_268 + 0x38),0,(char *)0x0,local_268._24_8_);
      }
      else {
LAB_00147545:
        puVar20 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            (local_268 + 0x18,(ulong)local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar28 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar28) {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210.field_2._8_8_ = puVar20[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar28;
        local_210._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_210._M_string_length = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)psVar28 = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      local_278._0_8_ = local_268;
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
        local_298._0_8_ = local_298 + 0x10;
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
        local_158._0_8_ = local_158 + 0x10;
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
      BVar29 = (BRDPoint)(pBVar21 + 2);
      if (*pBVar21 == BVar29) {
        local_1a8._16_8_ = *(undefined8 *)BVar29;
        auStack_190._0_8_ = pBVar21[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)BVar29;
        local_1a8._0_8_ = *pBVar21;
      }
      local_1a8._8_8_ = pBVar21[1];
      *pBVar21 = BVar29;
      pBVar21[1].x = 0;
      pBVar21[1].y = 0;
      *(undefined1 *)&pBVar21[2].x = 0;
      psVar33 = &(local_1b0->super_BRDFileBase).error_msg;
      std::__cxx11::string::operator=((string *)psVar33,(string *)local_1a8);
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) goto LAB_00145b6a;
      goto LAB_00145b77;
    }
    if (buffer == pcVar14 + (long)(pcVar39 + (4 - (long)pcVar47))) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
      local_268._24_8_ = local_268 + 0x28;
      puVar25 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = puVar20[3];
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*puVar20;
      }
      local_268._32_8_ = puVar20[1];
      *puVar20 = puVar25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      std::__cxx11::to_string((string *)(local_268 + 0x38),0x11b);
      std::operator+(&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_268 + 0x18),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_268 + 0x38));
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      local_278._0_8_ = local_268;
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      local_158._0_8_ = local_158 + 0x10;
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
    }
    else if (pcVar47 == (pointer)0x0) {
      auStack_1d8._8_8_ = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_1d8 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,"");
      puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
      local_268._24_8_ = local_268 + 0x28;
      puVar25 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar25) {
        local_240 = (char *)*puVar25;
        lStack_238 = puVar20[3];
      }
      else {
        local_240 = (char *)*puVar25;
        local_268._24_8_ = (ulong *)*puVar20;
      }
      local_268._32_8_ = puVar20[1];
      *puVar20 = puVar25;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      std::__cxx11::to_string((string *)(local_268 + 0x38),0x11c);
      std::operator+(&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_268 + 0x18),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_268 + 0x38));
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      local_1f0._0_8_ = &local_1e0;
      pp_Var26 = (_func_int **)(puVar20 + 2);
      if ((_func_int **)*puVar20 == pp_Var26) {
        local_1e0 = *pp_Var26;
        auStack_1d8._0_8_ = puVar20[3];
      }
      else {
        local_1e0 = *pp_Var26;
        local_1f0._0_8_ = (_func_int **)*puVar20;
      }
      local_1f0._8_8_ = puVar20[1];
      *puVar20 = pp_Var26;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1f0);
      local_278._0_8_ = local_268;
      pbVar43 = (pointer)(plVar15 + 2);
      if ((pointer)*plVar15 == pbVar43) {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_268._8_8_ = plVar15[3];
      }
      else {
        local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
        local_278._0_8_ = (pointer)*plVar15;
      }
      local_278._8_8_ = plVar15[1];
      *plVar15 = (long)pbVar43;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
      local_298._0_8_ = local_298 + 0x10;
      ppcVar27 = (char **)(puVar20 + 2);
      if ((char **)*puVar20 == ppcVar27) {
        local_298._16_8_ = *ppcVar27;
        local_298._24_8_ = puVar20[3];
      }
      else {
        local_298._16_8_ = *ppcVar27;
        local_298._0_8_ = (char **)*puVar20;
      }
      local_298._8_8_ = puVar20[1];
      *puVar20 = ppcVar27;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
      local_158._0_8_ = local_158 + 0x10;
      psVar28 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar28) {
        local_158._16_8_ = *psVar28;
        local_158._24_8_ = puVar20[3];
      }
      else {
        local_158._16_8_ = *psVar28;
        local_158._0_8_ = (size_type *)*puVar20;
      }
      local_158._8_8_ = puVar20[1];
      *puVar20 = psVar28;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
    }
    else {
      pcVar14 = decompress(pcVar14 + (long)(pcVar39 + (4 - (long)pcVar47)),(size_t)pcVar47,
                           (size_t *)&local_f8);
      if (pcVar14 == (char *)0x0) {
        auStack_1d8._8_8_ = &local_1c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(auStack_1d8 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                   ,"");
        puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
        local_268._24_8_ = local_268 + 0x28;
        puVar25 = puVar20 + 2;
        if ((ulong *)*puVar20 == puVar25) {
          local_240 = (char *)*puVar25;
          lStack_238 = puVar20[3];
        }
        else {
          local_240 = (char *)*puVar25;
          local_268._24_8_ = (ulong *)*puVar20;
        }
        local_268._32_8_ = puVar20[1];
        *puVar20 = puVar25;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        std::__cxx11::to_string((string *)(local_268 + 0x38),0x11e);
        std::operator+(&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_268 + 0x18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_268 + 0x38));
        puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        local_1f0._0_8_ = &local_1e0;
        pp_Var26 = (_func_int **)(puVar20 + 2);
        if ((_func_int **)*puVar20 == pp_Var26) {
          local_1e0 = *pp_Var26;
          auStack_1d8._0_8_ = puVar20[3];
        }
        else {
          local_1e0 = *pp_Var26;
          local_1f0._0_8_ = (_func_int **)*puVar20;
        }
        local_1f0._8_8_ = puVar20[1];
        *puVar20 = pp_Var26;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append(local_1f0);
        local_278._0_8_ = local_268;
        pbVar43 = (pointer)(plVar15 + 2);
        if ((pointer)*plVar15 == pbVar43) {
          local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
          local_268._8_8_ = plVar15[3];
        }
        else {
          local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
          local_278._0_8_ = (pointer)*plVar15;
        }
        local_278._8_8_ = plVar15[1];
        *plVar15 = (long)pbVar43;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
        local_298._0_8_ = local_298 + 0x10;
        ppcVar27 = (char **)(puVar20 + 2);
        if ((char **)*puVar20 == ppcVar27) {
          local_298._16_8_ = *ppcVar27;
          local_298._24_8_ = puVar20[3];
        }
        else {
          local_298._16_8_ = *ppcVar27;
          local_298._0_8_ = (char **)*puVar20;
        }
        local_298._8_8_ = puVar20[1];
        *puVar20 = ppcVar27;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
        local_158._0_8_ = local_158 + 0x10;
        psVar28 = puVar20 + 2;
        if ((size_type *)*puVar20 == psVar28) {
          local_158._16_8_ = *psVar28;
          local_158._24_8_ = puVar20[3];
        }
        else {
          local_158._16_8_ = *psVar28;
          local_158._0_8_ = (size_type *)*puVar20;
        }
        local_158._8_8_ = puVar20[1];
        *puVar20 = psVar28;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
      }
      else {
        if (local_f8 != (pointer)0x0) {
          local_158._0_8_ = &pFStack_128;
          local_158._8_8_ = 1;
          local_158._16_8_ = 0;
          local_158._24_8_ = 0;
          local_138 = 1.0;
          local_130 = (pointer)0x0;
          pFStack_128 = (pointer)0x0;
          local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          stringfile(buffer,&local_88);
          local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          stringfile(pcVar14,&local_c8);
          pcVar39 = (pointer)0x0;
          do {
            if (buffer[(long)pcVar39] == ',') {
              buffer[(long)pcVar39] = '.';
            }
            pcVar39 = pcVar39 + 1;
          } while (pcVar6 != pcVar39);
          local_100._0_4_ = 0;
          local_100._4_4_ = 0;
          if (local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_68 = (vector<BRDNail,std::allocator<BRDNail>> *)
                       &(local_1b0->super_BRDFileBase).nails;
            local_b0 = &(local_1b0->super_BRDFileBase).parts;
            local_70 = (vector<BRDPin,std::allocator<BRDPin>> *)&(local_1b0->super_BRDFileBase).pins
            ;
            local_120 = (pointer)CONCAT44(local_120._4_4_,0x3f800000);
            uVar46 = 0;
            local_100 = local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            ppcVar36 = local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ppcVar44 = local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            do {
              pBVar41 = (pointer)(*ppcVar44 + -1);
              do {
                pBVar40 = pBVar41;
                bVar35 = *(byte *)((long)&pBVar40->name + 1);
                pBVar41 = (pointer)((long)&pBVar40->name + 1);
                iVar12 = isspace((uint)bVar35);
                pBVar16 = (pointer)CONCAT44(extraout_var,iVar12);
              } while (iVar12 != 0);
              if (bVar35 != 0) {
                local_278._0_8_ = pBVar41;
                iVar12 = strcmp((char *)pBVar41,"UNIT:millimeters");
                local_118 = (pointer)CONCAT44(local_118._4_4_,0x41cb3333);
                if (iVar12 != 0) {
                  local_118 = (pointer)CONCAT44(local_118._4_4_,(uint)local_120);
                }
                pBVar16 = (pointer)0x0;
                if (*(char *)&pBVar41->name == 'S') {
                  pBVar16 = (pointer)((long)&pBVar40->name + 3);
                  if (uVar46 == 3) {
                    local_278._0_8_ = (long)&pBVar40->name + 5;
                    local_298._0_8_ = (char **)0x0;
                    local_298._8_8_ = (FZFile *)0x0;
                    local_298._16_8_ = "UNCONNECTED";
                    local_1a8._0_8_ = local_278;
                    local_1a8._8_8_ = (pointer)local_1f0;
                    local_1a8._16_8_ = &local_108;
                    auStack_190._0_8_ = &local_110;
                    local_298._16_8_ =
                         parse::anon_class_32_4_fa413470::operator()
                                   ((anon_class_32_4_fa413470 *)local_1a8);
                    local_1a8._0_8_ = local_278;
                    local_1a8._8_8_ = (pointer)local_1f0;
                    local_1a8._16_8_ = &local_108;
                    auStack_190._0_8_ = &local_110;
                    parse::anon_class_32_4_fa413470::operator()
                              ((anon_class_32_4_fa413470 *)local_1a8);
                    strtol((char *)local_278._0_8_,(char **)local_278,10);
                    if (*(char *)(char **)local_278._0_8_ == '!') {
                      local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                    }
                    local_1a8._8_8_ = local_1f0;
                    local_1a8._0_8_ = local_278;
                    local_1a8._16_8_ = &local_108;
                    auStack_190._0_8_ = &local_110;
                    parse::anon_class_32_4_fa413470::operator()
                              ((anon_class_32_4_fa413470 *)local_1a8);
                    dVar8 = strtod((char *)local_278._0_8_,(char **)local_278);
                    ppcVar36 = local_100;
                    if (*(char *)(char **)local_278._0_8_ == '!') {
                      local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                    }
                    local_120 = (pointer)(double)local_118._0_4_;
                    local_298._4_4_ = (int)(dVar8 * (double)local_120);
                    dVar8 = strtod((char *)local_278._0_8_,(char **)local_278);
                    if (*(char *)(char **)local_278._0_8_ == '!') {
                      local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                    }
                    local_298._8_4_ = (int)(dVar8 * (double)local_120);
                    local_1a8._0_8_ = local_278;
                    local_1a8._16_8_ = &local_108;
                    local_1a8._8_8_ = (pointer)local_1f0;
                    auStack_190._0_8_ = &local_110;
                    pcVar14 = parse::anon_class_32_4_fa413470::operator()
                                        ((anon_class_32_4_fa413470 *)local_1a8);
                    if ((*pcVar14 == 'T') && (pcVar14[1] == '\0')) {
                      uVar13 = 2;
                    }
                    else {
                      uVar13 = 1;
                    }
                    local_298._12_4_ = uVar13;
                    strtod((char *)local_278._0_8_,(char **)local_278);
                    if (*(char *)(char **)local_278._0_8_ == '!') {
                      local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                    }
                    __position_00._M_current =
                         (local_1b0->super_BRDFileBase).nails.
                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position_00._M_current ==
                        (local_1b0->super_BRDFileBase).nails.
                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<BRDNail,std::allocator<BRDNail>>::
                      _M_realloc_insert<BRDNail_const&>(local_68,__position_00,(BRDNail *)local_298)
                      ;
                      pBVar16 = extraout_RAX_00;
                    }
                    else {
                      (__position_00._M_current)->net = (char *)local_298._16_8_;
                      (__position_00._M_current)->probe = local_298._0_4_;
                      ((__position_00._M_current)->pos).x = local_298._4_4_;
                      *(undefined8 *)&((__position_00._M_current)->pos).y = local_298._8_8_;
                      ppBVar2 = &(local_1b0->super_BRDFileBase).nails.
                                 super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                      *ppBVar2 = *ppBVar2 + 1;
                      pBVar16 = (pointer)local_298._16_8_;
                    }
LAB_00146604:
                    uVar46 = 3;
                  }
                  else {
                    local_278._0_8_ = pBVar16;
                    if (uVar46 == 2) {
                      local_1a8._0_4_ = 0;
                      local_1a8._4_4_ = 0;
                      local_1a8._8_8_ = (pointer)0x0;
                      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffff00000000;
                      auStack_190._0_8_ = "UNCONNECTED";
                      auStack_190._8_8_ = (pointer)0x3fe0000000000000;
                      auStack_190._16_8_ = (pointer)0x0;
                      auStack_190._24_4_ = 0;
                      auStack_190._28_4_ = 0;
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      auStack_190._0_8_ =
                           parse::anon_class_32_4_fa413470::operator()
                                     ((anon_class_32_4_fa413470 *)local_298);
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      pcVar14 = parse::anon_class_32_4_fa413470::operator()
                                          ((anon_class_32_4_fa413470 *)local_298);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_298,pcVar14,(allocator<char> *)&local_210);
                      puVar18 = (uint *)std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)local_158,(key_type *)local_298);
                      local_1a8._12_4_ = *puVar18;
                      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
                      }
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      auStack_190._16_8_ =
                           parse::anon_class_32_4_fa413470::operator()
                                     ((anon_class_32_4_fa413470 *)local_298);
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      pcVar14 = parse::anon_class_32_4_fa413470::operator()
                                          ((anon_class_32_4_fa413470 *)local_298);
                      uVar24 = auStack_190._16_8_;
                      sVar19 = strlen((char *)auStack_190._16_8_);
                      ppcVar36 = local_100;
                      if ((sVar19 < 2) &&
                         ((cVar3 = (char)((BRDPoint *)uVar24)->x, cVar3 == '0' || (cVar3 == '\0'))))
                      {
                        auStack_190._24_4_ = SUB84(pcVar14,0);
                        auStack_190._28_4_ = (undefined4)((ulong)pcVar14 >> 0x20);
                      }
                      dVar8 = strtod((char *)local_278._0_8_,(char **)local_278);
                      if (*(char *)(char **)local_278._0_8_ == '!') {
                        local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                      }
                      local_120 = (pointer)(double)local_118._0_4_;
                      local_1a8._0_4_ = (int)(dVar8 * (double)local_120);
                      dVar8 = strtod((char *)local_278._0_8_,(char **)local_278);
                      if (*(char *)(char **)local_278._0_8_ == '!') {
                        local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                      }
                      local_1a8._4_4_ = (int)(dVar8 * (double)local_120);
                      local_298._8_8_ = local_1b0;
                      local_298._0_8_ = local_278;
                      local_1a8._8_4_ =
                           parse::anon_class_16_2_d7082a65::operator()
                                     ((anon_class_16_2_d7082a65 *)local_298);
                      dVar8 = strtod((char *)local_278._0_8_,(char **)local_278);
                      if (*(char *)(char **)local_278._0_8_ == '!') {
                        local_278._0_8_ = (long)(char **)local_278._0_8_ + 1;
                      }
                      dVar48 = 0.5;
                      if (0.5 <= dVar8 / 100.0) {
                        dVar48 = dVar8 / 100.0;
                      }
                      auStack_190._8_8_ = dVar48 * (double)local_120;
                      BVar4 = (local_b0->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>).
                              _M_impl.super__Vector_impl_data._M_start[local_1a8._12_4_ - 1].
                              mounting_side;
                      if (BVar4 < (Top|Bottom)) {
                        local_1a8._16_4_ = BVar4;
                      }
                      __position._M_current =
                           (local_1b0->super_BRDFileBase).pins.
                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (__position._M_current ==
                          (local_1b0->super_BRDFileBase).pins.
                          super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<BRDPin,std::allocator<BRDPin>>::_M_realloc_insert<BRDPin_const&>
                                  (local_70,__position,(BRDPin *)local_1a8);
                        pBVar16 = extraout_RAX_01;
                      }
                      else {
                        pBVar16 = (pointer)CONCAT44(auStack_190._28_4_,auStack_190._24_4_);
                        (__position._M_current)->name = (char *)pBVar16;
                        (__position._M_current)->radius = (double)auStack_190._8_8_;
                        (__position._M_current)->snum = (char *)auStack_190._16_8_;
                        *(undefined8 *)&(__position._M_current)->side = local_1a8._16_8_;
                        (__position._M_current)->net = (char *)auStack_190._0_8_;
                        ((__position._M_current)->pos).x = local_1a8._0_4_;
                        ((__position._M_current)->pos).y = local_1a8._4_4_;
                        (__position._M_current)->probe = local_1a8._8_4_;
                        (__position._M_current)->part = local_1a8._12_4_;
                        ppBVar1 = &(local_1b0->super_BRDFileBase).pins.
                                   super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
                        *ppBVar1 = *ppBVar1 + 1;
                      }
LAB_0014661c:
                      uVar46 = 2;
                    }
                    else if (uVar46 == 1) {
                      local_1a8._0_4_ = 0;
                      local_1a8._4_4_ = 0;
                      local_1a8._8_8_ = auStack_190;
                      local_1a8._16_8_ = (char **)0x0;
                      auStack_190._0_8_ = auStack_190._0_8_ & 0xffffffffffffff00;
                      auStack_190._32_4_ = 0;
                      BStack_16c.x = 0;
                      BStack_16c.y = 0;
                      auStack_190._16_8_ = (pointer)0x0;
                      auStack_190._24_4_ = 0;
                      auStack_190._28_4_ = 0;
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      local_1a8._0_8_ =
                           parse::anon_class_32_4_fa413470::operator()
                                     ((anon_class_32_4_fa413470 *)local_298);
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)local_298);
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)local_298);
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      pcVar14 = parse::anon_class_32_4_fa413470::operator()
                                          ((anon_class_32_4_fa413470 *)local_298);
                      local_298._0_8_ = local_278;
                      local_298._8_8_ = (FZFile *)local_1f0;
                      local_298._16_8_ = &local_108;
                      local_298._24_8_ = &local_110;
                      parse::anon_class_32_4_fa413470::operator()
                                ((anon_class_32_4_fa413470 *)local_298);
                      auStack_190._16_8_ = auStack_190._16_8_ & 0xffffffff;
                      iVar12 = strcmp(pcVar14,"YES");
                      auStack_190._16_4_ = (iVar12 == 0) + 1;
                      auStack_190._24_4_ = 0;
                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                (local_b0,(value_type *)local_1a8);
                      ppcVar36 = local_100;
                      pBVar41 = (local_1b0->super_BRDFileBase).parts.
                                super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                      pBVar16 = (local_1b0->super_BRDFileBase).parts.
                                super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_298,(char *)local_1a8._0_8_,
                                 (allocator<char> *)&local_210);
                      pmVar17 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)local_158,(key_type *)local_298);
                      *pmVar17 = (int)((ulong)((long)pBVar41 - (long)pBVar16) >> 3) * 0x38e38e39;
                      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
                      }
                      pBVar16 = (pointer)auStack_190;
                      if ((pointer)local_1a8._8_8_ != pBVar16) {
                        operator_delete((void *)local_1a8._8_8_,(ulong)(auStack_190._0_8_ + 1));
                        pBVar16 = extraout_RAX;
                      }
                      goto LAB_001460fc;
                    }
                  }
                }
                else if (*(char *)&pBVar41->name == 'A') {
                  pcVar14 = (char *)((long)&pBVar40->name + 3);
                  iVar12 = strncmp(pcVar14,"REFDES",6);
                  pBVar16 = (pointer)CONCAT44(extraout_var_00,iVar12);
                  if (iVar12 == 0) {
LAB_001460fc:
                    uVar46 = 1;
                  }
                  else {
                    iVar12 = strncmp(pcVar14,"NET_NAME",8);
                    pBVar16 = (pointer)CONCAT44(extraout_var_01,iVar12);
                    if (iVar12 == 0) goto LAB_0014661c;
                    iVar12 = strncmp(pcVar14,"TESTVIA",7);
                    pBVar16 = (pointer)CONCAT44(extraout_var_02,iVar12);
                    if (iVar12 == 0) goto LAB_00146604;
                    iVar12 = strncmp(pcVar14,"GRAPHIC_DATA_NAME",0x11);
                    pBVar16 = (pointer)CONCAT44(extraout_var_03,iVar12);
                    if (iVar12 == 0) {
                      uVar46 = 4;
                    }
                    else {
                      iVar12 = strncmp(pcVar14,"CLASS",5);
                      pBVar16 = (pointer)CONCAT44(extraout_var_04,iVar12);
                      if (iVar12 == 0) {
                        uVar46 = 5;
                      }
                      else {
                        iVar12 = strncmp(pcVar14,"LOGOInfo",8);
                        pBVar16 = (pointer)CONCAT44(extraout_var_05,iVar12);
                        if (iVar12 == 0) {
                          uVar46 = 6;
                        }
                        else {
                          iVar12 = strncmp(pcVar14,"UnDrawSym",9);
                          pBVar16 = (pointer)(ulong)(uint)-iVar12;
                          uVar46 = -(uint)(iVar12 != 0) | 7;
                        }
                      }
                    }
                  }
                }
                local_120 = (pointer)CONCAT44(local_120._4_4_,local_118._0_4_);
              }
              ppcVar44 = ppcVar44 + 1;
            } while (ppcVar44 != ppcVar36);
            local_100._1_7_ = (undefined7)((ulong)pBVar16 >> 8);
            local_100._0_1_ = uVar46 != 0;
          }
          if (0x10 < (ulong)((long)local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) {
            local_120 = (pointer)&(local_1b0->super_BRDFileBase).error_msg;
            local_118 = (pointer)&local_1b0->partsDesc;
            uVar45 = 2;
            ppcVar36 = local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ppcVar44 = local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            do {
              pbVar30 = (byte *)ppcVar44[uVar45];
              pbVar42 = pbVar30 + -1;
              do {
                pbVar30 = pbVar30 + 1;
                bVar35 = pbVar42[1];
                pbVar42 = pbVar42 + 1;
                iVar12 = isspace((uint)bVar35);
              } while (iVar12 != 0);
              if ((bVar35 != 0) && (local_160 = pbVar42, bVar35 != 0x73)) {
                auStack_190._0_8_ = (char **)0x0;
                auStack_190._8_8_ = (FZFile *)0x0;
                auStack_190._16_8_ = (pointer)0x0;
                bVar35 = *pbVar42;
                if ((bVar35 != 0) && (iVar12 = isspace((uint)bVar35), bVar35 != 9)) {
                  for (; ((iVar12 != 0 && (bVar35 = *pbVar30, pbVar42 = pbVar30, bVar35 != 0)) &&
                         (iVar12 = isspace((uint)bVar35), bVar35 != 9)); pbVar30 = pbVar30 + 1) {
                  }
                }
                paVar10 = &local_230.field_2;
                local_160 = pbVar42;
                do {
                  pbVar30 = local_160;
                  local_160 = pbVar30 + 1;
                  if (*pbVar30 == 0) break;
                } while (*pbVar30 != 9);
                *pbVar30 = 0;
                local_1a8._0_8_ = fix_to_utf8((char *)pbVar42,&local_108,local_110);
                pbVar42 = local_160;
                bVar35 = *local_160;
                pbVar30 = pbVar42;
                if (bVar35 == 0) {
                  bVar35 = 0;
                }
                else {
                  iVar12 = isspace((uint)bVar35);
                  if ((bVar35 != 9) && (iVar12 != 0)) {
                    while( true ) {
                      pbVar42 = pbVar42 + 1;
                      bVar35 = *pbVar42;
                      pbVar30 = pbVar42;
                      if (bVar35 == 0) break;
                      iVar12 = isspace((uint)bVar35);
                      if ((bVar35 == 9) || (iVar12 == 0)) goto LAB_00147bcf;
                    }
                    bVar35 = 0;
                  }
                }
LAB_00147bcf:
                while ((local_160 = pbVar42 + 1, bVar35 != 0 && (bVar35 != 9))) {
                  pbVar42 = local_160;
                  bVar35 = *local_160;
                }
                *pbVar42 = 0;
                local_1a8._8_8_ = fix_to_utf8((char *)pbVar30,&local_108,local_110);
                lVar22 = strtol((char *)local_160,(char **)&local_160,10);
                if (*local_160 == 9) {
                  local_160 = local_160 + 1;
                }
                pbVar42 = local_160;
                if ((int)lVar22 < 0) {
                  local_a8[0] = local_98;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                             ,"");
                  plVar15 = (long *)std::__cxx11::string::append((char *)local_a8);
                  puVar25 = (ulong *)(plVar15 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar15 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar25) {
                    local_230.field_2._M_allocated_capacity = *puVar25;
                    local_230.field_2._8_8_ = plVar15[3];
                    local_230._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_230.field_2._M_allocated_capacity = *puVar25;
                    local_230._M_dataplus._M_p = (pointer)*plVar15;
                  }
                  local_230._M_string_length = plVar15[1];
                  *plVar15 = (long)puVar25;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  local_e8 = local_d8;
                  std::__cxx11::string::_M_construct((ulong)&local_e8,'\x03');
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,3,0x1c2);
                  uVar24 = (char *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar10) {
                    uVar24 = local_230.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar24 < (char *)(local_e0 + local_230._M_string_length)) {
                    pcVar14 = (char *)0xf;
                    if (local_e8 != local_d8) {
                      pcVar14 = local_d8[0];
                    }
                    if (pcVar14 < (char *)(local_e0 + local_230._M_string_length))
                    goto LAB_00147d5c;
                    plVar15 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_e8,0,(char *)0x0,
                                                 (ulong)local_230._M_dataplus._M_p);
                  }
                  else {
LAB_00147d5c:
                    plVar15 = (long *)std::__cxx11::string::_M_append
                                                (local_268 + 0x38,(ulong)local_e8);
                  }
                  auStack_1d8._8_8_ = &local_1c0;
                  pBVar21 = (BRDPoint *)(plVar15 + 2);
                  if ((BRDPoint *)*plVar15 == pBVar21) {
                    local_1c0 = *pBVar21;
                    ppStack_1b8 = (pointer)plVar15[3];
                  }
                  else {
                    local_1c0 = *pBVar21;
                    auStack_1d8._8_8_ = (BRDPoint *)*plVar15;
                  }
                  local_1c8 = (pointer)plVar15[1];
                  *plVar15 = (long)pBVar21;
                  plVar15[1] = 0;
                  *(undefined1 *)&pBVar21->x = 0;
                  plVar15 = (long *)std::__cxx11::string::append(auStack_1d8 + 8);
                  local_268._24_8_ = local_268 + 0x28;
                  plVar31 = plVar15 + 2;
                  if ((long *)*plVar15 == plVar31) {
                    local_240 = (char *)*plVar31;
                    lStack_238 = plVar15[3];
                  }
                  else {
                    local_240 = (char *)*plVar31;
                    local_268._24_8_ = (long *)*plVar15;
                  }
                  local_268._32_8_ = plVar15[1];
                  *plVar15 = (long)plVar31;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  puVar20 = (undefined8 *)std::__cxx11::string::append(local_268 + 0x18);
                  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                  psVar28 = puVar20 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar20 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar28) {
                    local_210.field_2._M_allocated_capacity = *psVar28;
                    local_210.field_2._8_8_ = puVar20[3];
                  }
                  else {
                    local_210.field_2._M_allocated_capacity = *psVar28;
                    local_210._M_dataplus._M_p = (pointer)*puVar20;
                  }
                  local_210._M_string_length = puVar20[1];
                  *puVar20 = psVar28;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  plVar15 = (long *)std::__cxx11::string::append((char *)&local_210);
                  local_1f0._0_8_ = &local_1e0;
                  pp_Var26 = (_func_int **)(plVar15 + 2);
                  if ((_func_int **)*plVar15 == pp_Var26) {
                    local_1e0 = *pp_Var26;
                    auStack_1d8._0_8_ = plVar15[3];
                  }
                  else {
                    local_1e0 = *pp_Var26;
                    local_1f0._0_8_ = (_func_int **)*plVar15;
                  }
                  local_1f0._8_8_ = plVar15[1];
                  *plVar15 = (long)pp_Var26;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  puVar20 = (undefined8 *)std::__cxx11::string::append(local_1f0);
                  pBVar41 = (pointer)(puVar20 + 2);
                  if ((pointer)*puVar20 == pBVar41) {
                    local_268._0_8_ = pBVar41->name;
                    local_268._8_8_ = puVar20[3];
                    local_278._0_8_ = (pointer)local_268;
                  }
                  else {
                    local_268._0_8_ = pBVar41->name;
                    local_278._0_8_ = (pointer)*puVar20;
                  }
                  local_278._8_8_ = puVar20[1];
                  *puVar20 = pBVar41;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
                  ppcVar27 = (char **)(puVar20 + 2);
                  if ((char **)*puVar20 == ppcVar27) {
                    local_298._16_8_ = *ppcVar27;
                    local_298._24_8_ = puVar20[3];
                    local_298._0_8_ = local_298 + 0x10;
                  }
                  else {
                    local_298._16_8_ = *ppcVar27;
                    local_298._0_8_ = (char **)*puVar20;
                  }
                  local_298._8_8_ = puVar20[1];
                  *puVar20 = ppcVar27;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_120,(string *)local_298);
                  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                    operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
                  }
                  if ((pointer)local_278._0_8_ != (pointer)local_268) {
                    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
                  }
                  if ((_func_int **)local_1f0._0_8_ != &local_1e0) {
                    operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0 + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
                    operator_delete((void *)local_268._24_8_,(long)local_240 + 1);
                  }
                  if ((BRDPoint *)auStack_1d8._8_8_ != &local_1c0) {
                    operator_delete((void *)auStack_1d8._8_8_,(long)local_1c0 + 1);
                  }
                  if (local_e8 != local_d8) {
                    operator_delete(local_e8,(ulong)(local_d8[0] + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != paVar10) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    (ulong)(local_230.field_2._M_allocated_capacity + 1));
                  }
                  if (local_a8[0] != local_98) {
                    operator_delete(local_a8[0],local_98[0] + 1);
                  }
                  SDL_LogError(1,"%s",((_Alloc_hider *)&local_120->partno)->_M_p);
                }
                local_1a8._16_4_ = (int)lVar22;
                bVar35 = *pbVar42;
                pbVar30 = pbVar42;
                if ((bVar35 != 0) && (iVar12 = isspace((uint)bVar35), bVar35 != 9)) {
                  while (pbVar30 = pbVar42, iVar12 != 0) {
                    pbVar42 = pbVar42 + 1;
                    bVar35 = *pbVar42;
                    pbVar30 = pbVar42;
                    if ((bVar35 == 0) || (iVar12 = isspace((uint)bVar35), bVar35 == 9)) break;
                  }
                }
                do {
                  pbVar9 = pbVar30;
                  local_160 = pbVar9 + 1;
                  if (*pbVar9 == 0) break;
                  pbVar30 = local_160;
                } while (*pbVar9 != 9);
                *pbVar9 = 0;
                pcVar14 = fix_to_utf8((char *)pbVar42,&local_108,local_110);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,pcVar14,(allocator<char> *)local_1f0);
                split_string((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_278,&local_50);
                local_298._16_8_ = auStack_190._16_8_;
                local_298._8_8_ = auStack_190._8_8_;
                local_298._0_8_ = auStack_190._0_8_;
                auStack_190._16_8_ = local_268._0_8_;
                auStack_190._0_8_ = local_278._0_8_;
                auStack_190._8_8_ = local_278._8_8_;
                local_278._0_8_ = (pointer)0x0;
                local_278._8_8_ = (pointer)0x0;
                local_268._0_8_ = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_298);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_278);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                pbVar42 = local_160;
                bVar35 = *local_160;
                pbVar30 = pbVar42;
                if (bVar35 == 0) {
                  bVar35 = 0;
                }
                else {
                  iVar12 = isspace((uint)bVar35);
                  if ((bVar35 != 9) && (iVar12 != 0)) {
                    while( true ) {
                      pbVar42 = pbVar42 + 1;
                      bVar35 = *pbVar42;
                      pbVar30 = pbVar42;
                      if (bVar35 == 0) break;
                      iVar12 = isspace((uint)bVar35);
                      if ((bVar35 == 9) || (iVar12 == 0)) goto LAB_0014827f;
                    }
                    bVar35 = 0;
                  }
                }
LAB_0014827f:
                while ((local_160 = pbVar42 + 1, bVar35 != 0 && (bVar35 != 9))) {
                  pbVar42 = local_160;
                  bVar35 = *local_160;
                }
                *pbVar42 = 0;
                pcVar14 = fix_to_utf8((char *)pbVar30,&local_108,local_110);
                auStack_190._24_4_ = SUB84(pcVar14,0);
                auStack_190._28_4_ = (undefined4)((ulong)pcVar14 >> 0x20);
                std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>::push_back
                          ((vector<FZPartDesc,_std::allocator<FZPartDesc>_> *)local_118,
                           (value_type *)local_1a8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_190);
                ppcVar36 = local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                ppcVar44 = local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
              }
              uVar45 = uVar45 + 1;
            } while (uVar45 < (ulong)((long)ppcVar36 - (long)ppcVar44 >> 3));
          }
          pFVar34 = (local_1b0->partsDesc).
                    super__Vector_base<FZPartDesc,_std::allocator<FZPartDesc>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_118 = (local_1b0->partsDesc).
                      super__Vector_base<FZPartDesc,_std::allocator<FZPartDesc>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          this_00 = local_1b0;
          if (pFVar34 != local_118) {
            do {
              pbVar5 = (pFVar34->locations).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar43 = (pFVar34->locations).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar43 != pbVar5;
                  pbVar43 = pbVar43 + 1) {
                iVar23 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_158,pbVar43);
                if (iVar23.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  uVar37 = (long)*(int *)((long)iVar23.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                                ._M_cur + 0x28) - 1;
                  pBVar41 = (this_00->super_BRDFileBase).parts.
                            super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar45 = ((long)(this_00->super_BRDFileBase).parts.
                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pBVar41 >> 3) *
                           -0x71c71c71c71c71c7;
                  if (uVar45 < uVar37 || uVar45 - uVar37 == 0) {
                    uVar24 = std::__throw_out_of_range_fmt
                                       (
                                       "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       );
                    if (local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_c8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_c8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_88.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_88.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_88.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)local_158);
                    _Unwind_Resume(uVar24);
                  }
                  pcVar14 = pFVar34->description;
                  pcVar6 = (char *)pBVar41[uVar37].mfgcode._M_string_length;
                  strlen(pcVar14);
                  std::__cxx11::string::_M_replace
                            ((ulong)&pBVar41[uVar37].mfgcode,0,pcVar6,(ulong)pcVar14);
                  this_00 = local_1b0;
                }
              }
              pFVar34 = pFVar34 + 1;
            } while (pFVar34 != local_118);
          }
          ppcVar36 = local_100;
          pBVar7 = (this_00->super_BRDFileBase).pins.
                   super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar22 = (long)(this_00->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pBVar7;
          if (lVar22 != 0) {
            lVar22 = (lVar22 >> 3) * 0x6db6db6db6db6db7;
            pBVar41 = (this_00->super_BRDFileBase).parts.
                      super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar18 = &pBVar7->part;
            lVar38 = 0;
            do {
              if (*puVar18 != 0) {
                pBVar41[*puVar18 - 1].end_of_pins = (uint)lVar38;
              }
              lVar38 = lVar38 + 1;
              puVar18 = puVar18 + 0xe;
            } while (lVar22 + (ulong)(lVar22 == 0) != lVar38);
          }
          gen_outline(this_00);
          update_counts(this_00);
          setlocale(1,local_58);
          (this_00->super_BRDFileBase).valid = SUB81(ppcVar36,0);
          if (SUB81(ppcVar36,0) == false) {
            fz_key_to_string<44ul>((string *)local_298,local_60,fzkey_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"FZ Key:\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_298);
            std::__cxx11::string::_M_append
                      ((char *)&(this_00->super_BRDFileBase).error_msg,local_1a8._0_8_);
            if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
          }
          if (local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_158);
          return;
        }
        auStack_1d8._8_8_ = &local_1c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(auStack_1d8 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                   ,"");
        puVar20 = (undefined8 *)std::__cxx11::string::append(auStack_1d8 + 8);
        local_268._24_8_ = local_268 + 0x28;
        puVar25 = puVar20 + 2;
        if ((ulong *)*puVar20 == puVar25) {
          local_240 = (char *)*puVar25;
          lStack_238 = puVar20[3];
        }
        else {
          local_240 = (char *)*puVar25;
          local_268._24_8_ = (ulong *)*puVar20;
        }
        local_268._32_8_ = puVar20[1];
        *puVar20 = puVar25;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        std::__cxx11::to_string((string *)(local_268 + 0x38),0x11f);
        std::operator+(&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_268 + 0x18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_268 + 0x38));
        puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        local_1f0._0_8_ = &local_1e0;
        pp_Var26 = (_func_int **)(puVar20 + 2);
        if ((_func_int **)*puVar20 == pp_Var26) {
          local_1e0 = *pp_Var26;
          auStack_1d8._0_8_ = puVar20[3];
        }
        else {
          local_1e0 = *pp_Var26;
          local_1f0._0_8_ = (_func_int **)*puVar20;
        }
        local_1f0._8_8_ = puVar20[1];
        *puVar20 = pp_Var26;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append(local_1f0);
        local_278._0_8_ = local_268;
        pbVar43 = (pointer)(plVar15 + 2);
        if ((pointer)*plVar15 == pbVar43) {
          local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
          local_268._8_8_ = plVar15[3];
        }
        else {
          local_268._0_8_ = (pbVar43->_M_dataplus)._M_p;
          local_278._0_8_ = (pointer)*plVar15;
        }
        local_278._8_8_ = plVar15[1];
        *plVar15 = (long)pbVar43;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_278);
        local_298._0_8_ = local_298 + 0x10;
        ppcVar27 = (char **)(puVar20 + 2);
        if ((char **)*puVar20 == ppcVar27) {
          local_298._16_8_ = *ppcVar27;
          local_298._24_8_ = puVar20[3];
        }
        else {
          local_298._16_8_ = *ppcVar27;
          local_298._0_8_ = (char **)*puVar20;
        }
        local_298._8_8_ = puVar20[1];
        *puVar20 = ppcVar27;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        puVar20 = (undefined8 *)std::__cxx11::string::append(local_298);
        local_158._0_8_ = local_158 + 0x10;
        psVar28 = puVar20 + 2;
        if ((size_type *)*puVar20 == psVar28) {
          local_158._16_8_ = *psVar28;
          local_158._24_8_ = puVar20[3];
        }
        else {
          local_158._16_8_ = *psVar28;
          local_158._0_8_ = (size_type *)*puVar20;
        }
        local_158._8_8_ = puVar20[1];
        *puVar20 = psVar28;
        puVar20[1] = 0;
        *(undefined1 *)(puVar20 + 2) = 0;
        pBVar21 = (BRDPoint *)std::__cxx11::string::append(local_158);
      }
    }
    BVar29 = (BRDPoint)(pBVar21 + 2);
    if (*pBVar21 == BVar29) {
      local_1a8._16_8_ = *(undefined8 *)BVar29;
      auStack_190._0_8_ = pBVar21[3];
      local_1a8._0_8_ = (long)local_1a8 + 0x10;
    }
    else {
      local_1a8._16_8_ = *(undefined8 *)BVar29;
      local_1a8._0_8_ = *pBVar21;
    }
    local_1a8._8_8_ = pBVar21[1];
    *pBVar21 = BVar29;
    pBVar21[1].x = 0;
    pBVar21[1].y = 0;
    *(undefined1 *)&pBVar21[2].x = 0;
    psVar33 = &(local_1b0->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar33,(string *)local_1a8);
    if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
    }
    if ((pointer)local_278._0_8_ != (pointer)local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
    }
    if ((_func_int **)local_1f0._0_8_ != &local_1e0) {
      operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      (ulong)(local_230.field_2._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_268._24_8_ != local_268 + 0x28) {
      operator_delete((void *)local_268._24_8_,(ulong)(local_240 + 1));
    }
    if ((BRDPoint *)auStack_1d8._8_8_ == &local_1c0) goto LAB_00145c29;
  }
  operator_delete((void *)auStack_1d8._8_8_,(long)local_1c0 + 1);
LAB_00145c29:
  SDL_LogError(1,"%s",(psVar33->_M_dataplus)._M_p);
  return;
}

Assistant:

void FZFile::parse(std::vector<char> &buf, const std::array<uint32_t, 44> &fzkey) {
	auto buffer_size = buf.size();
	char *saved_locale;
	float multiplier = 1.0f;
	saved_locale     = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (check_fz_key(fzkey)) {
		key = fzkey;
	} else if (!check_fz_key(key)) { // Try to fallback to built-in key
		valid = false;
		error_msg = getKeyErrorMsg();
		error_msg += fz_key_to_string(fzkey);
		return;
	}

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	/*
	 * Some non-encrypted, but zip-encoded files are popping up now and then.
	 *
	 * Thanks to piernov for noticing the starting byte sequence
	 *
	 * Attempt to decode using the decode() call and subsequently
	 * split the file to get the content.  If that fails, then try again
	 * without decoding.
	 */

	uint8_t s1 = file_buf[4];
	uint8_t s2 = file_buf[5];
	if (!((s1 == 0x78) && ((s2 == 0x9C) || (s2 == 0xDA)))) {

		/*
		 * Doesn't have the zlib signature, so decode it first.
		 *
		 * 1 in ~2^16 chance of a false hit.
		 */
		FZFile::decode(file_buf, buffer_size); // RC6 decryption
		                                       // fprintf(stderr,"FZFile:Decoded\n");
	}

	size_t content_size = 0;
	size_t descr_size   = 0;
	char *descr;
	char *content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it

	/*
  if (!content) {
	 // Decryption must have failed, so try again now without decrypting the data
	std::copy(buf.begin(), buf.end(), file_buf);
	content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it
  }
  */

	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);
	content = FZFile::decompress(content, content_size, content_size); // decompress zlib content data
	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);

	ENSURE_OR_FAIL(content != descr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);
	descr = FZFile::decompress(descr, descr_size, descr_size);
	ENSURE_OR_FAIL(descr != nullptr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);

	int current_block = 0;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number

	std::vector<char *> lines_content;
	stringfile(content, lines_content);

	std::vector<char *> lines_descr;
	stringfile(descr, lines_descr);

	// For some reason, some boards have COMMAs as decimal separators. Will wonders ever cease ( I realise this is a regional thing
	// )?
	std::replace(content, content + content_size, ',', '.');

	// Parse the content part (parts, pins, nails)

	for (char *line : lines_content) {
		//	fprintf(stdout,"%s\n", line);

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		/*
		 * If we have a UNIT: line in the data, see if it's requesting millimeters and scale appropriatley.
		 * Default is units are thou (0.001")
		 */
		if (!strcmp(line, "UNIT:millimeters")) {
			multiplier = 25.4f;
		}

		if (line[0] == 'A') { // New block
			line += 2;        // skip "A!"
			if (!strncmp(line, "REFDES", 6)) {
				current_block = 1;
			} else if (!strncmp(line, "NET_NAME", 8)) {
				current_block = 2;
			} else if (!strncmp(line, "TESTVIA", 7)) {
				current_block = 3;
			} else if (!strncmp(line, "GRAPHIC_DATA_NAME", 17)) {
				current_block = 4;
			} else if (!strncmp(line, "CLASS", 5)) {
				current_block = 5;
			} else if (!strncmp(line, "LOGOInfo", 8)) {
				current_block = 6;
			} else if (!strncmp(line, "UnDrawSym", 9)) {
				current_block = 7;
			} else {
				current_block = -1;
			}
			continue;
		} else if (line[0] != 'S') // Unknown line type
			continue;              // jump to next line
		else
			p += 2; // Skip "S!"

		switch (current_block) {
			case 1: { // Parts
				BRDPart part;
				part.name = READ_STR();
				/*char *cic =*/READ_STR();
				/*char *sname =*/READ_STR();
				char *smirror = READ_STR();
				/*char *srotate =*/READ_STR();
				part.part_type = BRDPartType::SMD;
				if (!strcmp(smirror, "YES"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case 2: { // Pins
				/* There are more then single FZ file variant even if all those files ahre same header looking like
				A!NET_NAME!REFDES!PIN_NUMBER!PIN_NAME!PIN_X!PIN_Y!TEST_POINT!RADIUS!

				There are at least 2 variants, placing BGA pin label in different places:
				S!SATA_GP1!SU1!AJ43!GPP_E1/SATAXPCIE1/SATAGP1!3315.86!1830.70!!6!
				S!SNN_FBA_WCKB45*!G1!0!AJ31!3140.51!1436.167!!7.48106!

				For first variant the PIN_NAME column is ignored until thre would be a filed for handling/displaying such info
				But for second varinat the PIN_NUMBER column is always the "0" literal, so PIN_NAME is used as name.
				*/
				BRDPin pin;
				pin.net    = READ_STR();
				char *part = READ_STR();
				pin.part   = parts_id.at(part);
				pin.snum   = READ_STR();
				char *name = READ_STR();

				// use name field as pin name if snum is empty string or "0" (decimal zero as string)
				bool name_is_pin_position_id = strlen(pin.snum) <= 1 && (pin.snum[0] == '\0' or pin.snum[0] == '0');
				if (name_is_pin_position_id)
				{
					pin.name = name;
				}
				double posx   = READ_DOUBLE();
				pin.pos.x     = posx * multiplier;
				double posy   = READ_DOUBLE();
				pin.pos.y     = posy * multiplier;
				pin.probe     = READ_UINT();
				double radius = READ_DOUBLE();
				radius /= 100;
				if (radius < 0.5f) radius = 0.5f;
				pin.radius                = radius * multiplier;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case 3: {   // Nails
				p += 2; // Skip "Y!"
				BRDNail nail;
				nail.net = READ_STR();
				/*char *refdes =*/READ_STR();
				/*int pinnumber =*/READ_INT(); // uint
				/*char *pinname =*/READ_STR();

				double posx = READ_DOUBLE();
				nail.pos.x  = posx * multiplier;
				double posy = READ_DOUBLE();
				nail.pos.y  = posy * multiplier;
				char *loc   = READ_STR();
				if (!strcmp(loc, "T"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;
				/*double radius =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			case 4: { // Drawing
			} break;
			case 5: { // Unknown
			} break;
			case 6: { // Logo/Info
			} break;
			case 7: { // Unknown
			} break;
		}
	}

	// Parse the descr part (parts info)
	// Note: Discard first 2 lines (board description, currently unused and table columns name)
	for (size_t i = 2; i < lines_descr.size(); ++i) {
		char *line = lines_descr[i];

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (line[0] == 's') continue; // PARTNUMBER starting with 's' seems unused

		FZPartDesc pdesc;
		pdesc.partno      = READ_DESCR_STR();
		pdesc.description = READ_DESCR_STR();
		pdesc.quantity    = READ_DESCR_UINT();
		pdesc.locations   = split_string(READ_DESCR_STR());
		pdesc.partno2     = READ_DESCR_STR();
		partsDesc.push_back(pdesc);
	}

	for (auto &pdesc : partsDesc) {
		for (auto &partname : pdesc.locations) {
			auto iter = parts_id.find(partname);
			if (iter != parts_id.end()) { // Sometimes the desc part references stuff not in content part, ignore it
				parts.at(iter->second - 1).mfgcode = pdesc.description;
			}
		}
	}

	//	std::sort(pins.begin(), pins.end()); // sort vector by part num then pin num
	for (std::vector<int>::size_type i = 0; i < pins.size(); i++) {
		// update end_of_pins field
		if (pins[i].part > 0) parts[pins[i].part - 1].end_of_pins = i;
	}

	gen_outline();

	update_counts();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;

	if (!valid) {
		error_msg += "FZ Key:\n" + fz_key_to_string(key);
	}
}